

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aierror.cpp
# Opt level: O0

string * __thiscall
ai::stringFromErrno_abi_cxx11_(string *__return_storage_ptr__,ai *this,int error_code)

{
  char *pcVar1;
  allocator<char> local_95 [20];
  allocator<char> local_81;
  undefined8 local_80;
  unsigned_long buf_len;
  char buf_err [100];
  int error_code_local;
  
  buf_err._92_4_ = SUB84(this,0);
  unique0x100000e8 = __return_storage_ptr__;
  memset(&buf_len,0,100);
  local_80 = 100;
  pcVar1 = strerror_r(buf_err._92_4_,(char *)&buf_len,100);
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)&buf_len,&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"!formatting errno failed!",local_95);
    std::allocator<char>::~allocator(local_95);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringFromErrno(const int error_code)
    {
        char buf_err[100] = {0};
        const auto buf_len = std::extent<decltype(buf_err)>::value;
#ifdef _MSC_VER
        if (!strerror_s(buf_err, buf_len, error_code))
        {
            return buf_err;
        }
#else
        if (!strerror_r(error_code, buf_err, buf_len))
        {
            return buf_err;
        }
#endif        
        return "!formatting errno failed!";
    }